

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btCollisionWorldImporter.cpp
# Opt level: O0

btCompoundShape * __thiscall
btCollisionWorldImporter::createCompoundShape(btCollisionWorldImporter *this)

{
  btCompoundShape *_Val;
  int in_stack_00000018;
  bool in_stack_0000001f;
  btCompoundShape *in_stack_00000020;
  btCompoundShape *shape;
  btAlignedObjectArray<btCollisionShape_*> *in_stack_ffffffffffffffe0;
  
  _Val = (btCompoundShape *)btCompoundShape::operator_new(0x18801c);
  btCompoundShape::btCompoundShape(in_stack_00000020,in_stack_0000001f,in_stack_00000018);
  btAlignedObjectArray<btCollisionShape_*>::push_back
            (in_stack_ffffffffffffffe0,(btCollisionShape **)_Val);
  return _Val;
}

Assistant:

btCompoundShape* btCollisionWorldImporter::createCompoundShape()
{
	btCompoundShape* shape = new btCompoundShape();
	m_allocatedCollisionShapes.push_back(shape);
	return shape;
}